

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# empty.c
# Opt level: O1

int main(void)

{
  int iVar1;
  time_t tVar2;
  GLFWwindow *handle;
  float fVar3;
  float fVar4;
  float fVar5;
  int result;
  int height;
  thrd_t thread;
  int local_2c;
  float local_28;
  int local_24;
  thrd_t local_20;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 != 0) {
    handle = glfwCreateWindow(0x280,0x1e0,"Empty Event Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      glfwSetKeyCallback(handle,key_callback);
      iVar1 = thrd_create(&local_20,thread_main,(void *)0x0);
      if (iVar1 == 1) {
        if (running != '\0') {
          do {
            iVar1 = rand();
            fVar5 = (float)iVar1 * 4.656613e-10;
            iVar1 = rand();
            fVar3 = (float)iVar1 * 4.656613e-10;
            iVar1 = rand();
            local_28 = (float)iVar1 * 4.656613e-10;
            fVar4 = local_28 * local_28 + fVar5 * fVar5 + fVar3 * fVar3;
            if (fVar4 < 0.0) {
              fVar4 = sqrtf(fVar4);
            }
            else {
              fVar4 = SQRT(fVar4);
            }
            glfwGetFramebufferSize(handle,&local_2c,&local_24);
            glViewport(0,0,local_2c,local_24);
            glClearColor(fVar5 / fVar4,fVar3 / fVar4,local_28 / fVar4,0x3f800000);
            glClear(0x4000);
            glfwSwapBuffers(handle);
            glfwWaitEvents();
            iVar1 = glfwWindowShouldClose(handle);
            if (iVar1 != 0) {
              running = '\0';
            }
          } while (running != '\0');
        }
        glfwHideWindow(handle);
        thrd_join(local_20,&local_2c);
        glfwDestroyWindow(handle);
        glfwTerminate();
        exit(0);
      }
      fwrite("Failed to create secondary thread\n",0x22,1,_stderr);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    int result;
    thrd_t thread;
    GLFWwindow* window;

    srand((unsigned int) time(NULL));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    window = glfwCreateWindow(640, 480, "Empty Event Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    glfwSetKeyCallback(window, key_callback);

    if (thrd_create(&thread, thread_main, NULL) != thrd_success)
    {
        fprintf(stderr, "Failed to create secondary thread\n");

        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    while (running)
    {
        int width, height;
        float r = nrand(), g = nrand(), b = nrand();
        float l = (float) sqrt(r * r + g * g + b * b);

        glfwGetFramebufferSize(window, &width, &height);

        glViewport(0, 0, width, height);
        glClearColor(r / l, g / l, b / l, 1.f);
        glClear(GL_COLOR_BUFFER_BIT);
        glfwSwapBuffers(window);

        glfwWaitEvents();

        if (glfwWindowShouldClose(window))
            running = GL_FALSE;
    }

    glfwHideWindow(window);
    thrd_join(thread, &result);
    glfwDestroyWindow(window);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}